

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_graphics_pipelines
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines)

{
  ConstMemberIterator pipelines_00;
  bool bVar1;
  Pointer member;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_40;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_38;
  ConstMemberIterator itr;
  Value *pipelines_local;
  DatabaseInterface *resolver_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  itr.ptr_ = (Pointer)pipelines;
  local_38.ptr_ =
       (Pointer)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberBegin(pipelines);
  while( true ) {
    local_40.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberEnd(&(itr.ptr_)->name);
    bVar1 = rapidjson::
            GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator!=((GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&local_38,&local_40);
    pipelines_00 = itr;
    if (!bVar1) {
      (**(code **)(*(long *)iface + 0x88))();
      return true;
    }
    member = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator->(&local_38);
    bVar1 = parse_graphics_pipeline(this,iface,resolver,&(pipelines_00.ptr_)->name,&member->name);
    if (!bVar1) break;
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++(&local_38);
  }
  return false;
}

Assistant:

bool StateReplayer::Impl::parse_graphics_pipelines(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &pipelines)
{
	for (auto itr = pipelines.MemberBegin(); itr != pipelines.MemberEnd(); ++itr)
		if (!parse_graphics_pipeline(iface, resolver, pipelines, itr->name))
			return false;
	iface.notify_replayed_resources_for_type();
	return true;
}